

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# monitor.c
# Opt level: O0

GLFWvidmode * glfwGetVideoModes(GLFWmonitor *handle,int *count)

{
  GLFWbool GVar1;
  _GLFWmonitor *in_RSI;
  long in_RDI;
  _GLFWmonitor *monitor;
  GLFWvidmode *local_8;
  
  in_RSI->name[0] = '\0';
  in_RSI->name[1] = '\0';
  in_RSI->name[2] = '\0';
  in_RSI->name[3] = '\0';
  if (_glfw.initialized == 0) {
    _glfwInputError(0x10001,(char *)0x0);
    local_8 = (GLFWvidmode *)0x0;
  }
  else {
    GVar1 = refreshVideoModes(in_RSI);
    if (GVar1 == 0) {
      local_8 = (GLFWvidmode *)0x0;
    }
    else {
      *(undefined4 *)in_RSI->name = *(undefined4 *)(in_RDI + 0xa0);
      local_8 = *(GLFWvidmode **)(in_RDI + 0x98);
    }
  }
  return local_8;
}

Assistant:

GLFWAPI const GLFWvidmode* glfwGetVideoModes(GLFWmonitor* handle, int* count)
{
    _GLFWmonitor* monitor = (_GLFWmonitor*) handle;
    assert(monitor != NULL);
    assert(count != NULL);

    *count = 0;

    _GLFW_REQUIRE_INIT_OR_RETURN(NULL);

    if (!refreshVideoModes(monitor))
        return NULL;

    *count = monitor->modeCount;
    return monitor->modes;
}